

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.cc
# Opt level: O0

void testing::internal::InitGoogleMockImpl<wchar_t>(int *argc,wchar_t **argv)

{
  bool bVar1;
  char *str;
  wchar_t **extraout_RDX;
  wchar_t **streamable;
  wchar_t **extraout_RDX_00;
  int local_58;
  int j;
  char *arg;
  string arg_string;
  int i;
  wchar_t **argv_local;
  int *argc_local;
  
  InitGoogleTest(argc,argv);
  if (0 < *argc) {
    streamable = extraout_RDX;
    for (arg_string.field_2._12_4_ = 1; arg_string.field_2._12_4_ != *argc;
        arg_string.field_2._12_4_ = arg_string.field_2._12_4_ + 1) {
      StreamableToString<wchar_t*>
                ((string *)&arg,(internal *)(argv + (int)arg_string.field_2._12_4_),streamable);
      str = (char *)std::__cxx11::string::c_str();
      bVar1 = ParseGoogleMockBoolFlag
                        (str,"catch_leaked_mocks",(bool *)&FLAGS_gmock_catch_leaked_mocks);
      if ((bVar1) ||
         (bVar1 = ParseGoogleMockStringFlag<std::__cxx11::string>
                            (str,"verbose",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             FLAGS_gmock_verbose_abi_cxx11_), bVar1)) {
        for (local_58 = arg_string.field_2._12_4_; local_58 != *argc; local_58 = local_58 + 1) {
          argv[local_58] = argv[local_58 + 1];
        }
        *argc = *argc + -1;
        arg_string.field_2._12_4_ = arg_string.field_2._12_4_ + -1;
      }
      std::__cxx11::string::~string((string *)&arg);
      streamable = extraout_RDX_00;
    }
  }
  return;
}

Assistant:

void InitGoogleMockImpl(int* argc, CharType** argv) {
  // Makes sure Google Test is initialized.  InitGoogleTest() is
  // idempotent, so it's fine if the user has already called it.
  InitGoogleTest(argc, argv);
  if (*argc <= 0) return;

  for (int i = 1; i != *argc; i++) {
    const std::string arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    // Do we see a Google Mock flag?
    if (ParseGoogleMockBoolFlag(arg, "catch_leaked_mocks",
                                &GMOCK_FLAG(catch_leaked_mocks)) ||
        ParseGoogleMockStringFlag(arg, "verbose", &GMOCK_FLAG(verbose))) {
      // Yes.  Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    }
  }
}